

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_File.cpp
# Opt level: O1

uint64_t axl::io::copyFile(StringRef *srcFileName,StringRef *dstFileName,uint64_t size)

{
  int iVar1;
  uint64_t uVar2;
  File srcFile;
  File local_1c;
  
  local_1c.m_file.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h =
       (FileImpl)(Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>)0xffffffff;
  iVar1 = File::open(&local_1c,(char *)srcFileName,1);
  uVar2 = 0xffffffffffffffff;
  if ((char)iVar1 != '\0') {
    uVar2 = copyFile(&local_1c,dstFileName,size);
  }
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&local_1c);
  return uVar2;
}

Assistant:

uint64_t
copyFile(
	const sl::StringRef& srcFileName,
	const sl::StringRef& dstFileName,
	uint64_t size
) {
	File srcFile;
	bool result = srcFile.open(srcFileName, FileFlag_ReadOnly);
	if (!result)
		return -1;

	return copyFile(&srcFile, dstFileName, size);
}